

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

void entry_prog_ilopheth_flute(ROOM_INDEX_DATA *room,CHAR_DATA *ch)

{
  bool bVar1;
  ROOM_INDEX_DATA *pRVar2;
  ROOM_INDEX_DATA *pRVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ROOM_INDEX_DATA *in_RDI;
  char buf [4608];
  CHAR_DATA *vch;
  CHAR_DATA *man;
  ROOM_INDEX_DATA *adj;
  ROOM_INDEX_DATA *cliff;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  void *in_stack_ffffffffffffedb0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  CHAR_DATA *local_30;
  CHAR_DATA *local_28;
  
  local_28 = (CHAR_DATA *)0x0;
  pRVar2 = get_room_index((int)((ulong)in_stack_ffffffffffffedb8 >> 0x20));
  pRVar3 = get_room_index((int)((ulong)in_stack_ffffffffffffedb8 >> 0x20));
  local_30 = pRVar2->people;
  do {
    if (local_30 == (CHAR_DATA *)0x0) {
LAB_006bda0a:
      if (local_28 != (CHAR_DATA *)0x0) {
        if (in_RDI == pRVar2) {
          ch_00 = (CHAR_DATA *)&stack0xffffffffffffedc8;
          pcVar4 = get_char_color(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
          pcVar5 = END_COLOR(ch_00);
          sprintf((char *)ch_00,
                  "%sThe weathered old man ceases his flute-playing and regards you intently.%s",
                  pcVar4,pcVar5);
          act(pcVar4,ch_00,in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,0);
        }
        else if (in_RDI == pRVar3) {
          pcVar4 = &stack0xffffffffffffedc8;
          pcVar5 = get_char_color(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
          pcVar6 = END_COLOR(in_stack_ffffffffffffedb8);
          sprintf(pcVar4,
                  "%sA haunting melody echoes from the north, its rich tones exuding melancholy and grief.%s"
                  ,pcVar5,pcVar6);
          act(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,pcVar5,pcVar4,0);
        }
      }
      return;
    }
    bVar1 = is_npc(in_stack_ffffffffffffeda8);
    if ((bVar1) && (local_30->pIndexData->vnum == 0x2332)) {
      local_28 = local_30;
      goto LAB_006bda0a;
    }
    local_30 = local_30->next_in_room;
  } while( true );
}

Assistant:

void entry_prog_ilopheth_flute(ROOM_INDEX_DATA *room, CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *cliff, *adj;
	CHAR_DATA *man = nullptr, *vch;
	char buf[MSL];

	cliff = get_room_index(9121);
	adj = get_room_index(9120);

	for (vch = cliff->people; vch; vch = vch->next_in_room)
	{
		if (!is_npc(vch))
			continue;
		if (vch->pIndexData->vnum == 9010)
		{
			man = vch;
			break;
		}
	}

	if (!man)
		return;

	if (room == cliff)
	{
		sprintf(buf, "%sThe weathered old man ceases his flute-playing and regards you intently.%s",
			get_char_color(ch, "magenta"),
			END_COLOR(ch));
		act(buf, man, 0, ch, TO_VICT);
	}
	else if (room == adj)
	{
		sprintf(buf, "%sA haunting melody echoes from the north, its rich tones exuding melancholy and grief.%s",
			get_char_color(ch, "magenta"),
			END_COLOR(ch));
		act(buf, ch, 0, 0, TO_CHAR);
	}
}